

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3NextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  sqlite3_vtab *psVar2;
  Fts3Cursor *pCsr;
  int rc;
  sqlite3_vtab_cursor *pCursor_local;
  
  if ((*(short *)&pCursor[1].pVtab == 1) || (*(short *)&pCursor[1].pVtab == 0)) {
    iVar1 = sqlite3_step((sqlite3_stmt *)pCursor[2].pVtab);
    if (iVar1 == 100) {
      psVar2 = (sqlite3_vtab *)sqlite3_column_int64((sqlite3_stmt *)pCursor[2].pVtab,0);
      pCursor[6].pVtab = psVar2;
      pCsr._4_4_ = 0;
    }
    else {
      *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
      pCsr._4_4_ = sqlite3_reset((sqlite3_stmt *)pCursor[2].pVtab);
    }
  }
  else {
    pCsr._4_4_ = fts3EvalNext((Fts3Cursor *)pCursor);
  }
  return pCsr._4_4_;
}

Assistant:

static int fts3NextMethod(sqlite3_vtab_cursor *pCursor){
  int rc;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;
  if( pCsr->eSearch==FTS3_DOCID_SEARCH || pCsr->eSearch==FTS3_FULLSCAN_SEARCH ){
    if( SQLITE_ROW!=sqlite3_step(pCsr->pStmt) ){
      pCsr->isEof = 1;
      rc = sqlite3_reset(pCsr->pStmt);
    }else{
      pCsr->iPrevId = sqlite3_column_int64(pCsr->pStmt, 0);
      rc = SQLITE_OK;
    }
  }else{
    rc = fts3EvalNext((Fts3Cursor *)pCursor);
  }
  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}